

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_112f20f::HandleRename
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  RenameResult RVar4;
  int iVar5;
  string *psVar6;
  pointer member;
  char *pcVar7;
  string_view value;
  string_view value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  static_string_view name;
  static_string_view name_00;
  string err;
  string newname;
  string oldname;
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  undefined1 local_108 [16];
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  char *apcStack_b0 [2];
  undefined1 auStack_a0 [16];
  char *apcStack_90 [2];
  pointer ppStack_80;
  pointer local_78;
  pointer ppStack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  member = (pointer)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1);
  if (member < (pointer)0x41) {
    local_d8._0_8_ = (ActionMap *)local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"RENAME must be called with at least two additional arguments","")
    ;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_d8._0_8_ != (ActionMap *)local_c8) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
    }
    return false;
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  bVar3 = cmsys::SystemTools::FileIsFullPath(&local_128);
  if (!bVar3) {
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_d8._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_d8._0_8_ = psVar6->_M_string_length;
    local_108._8_8_ = &local_f8;
    local_108._0_8_ = 1;
    local_f8 = CONCAT71(local_f8._1_7_,0x2f);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c8._0_8_ = &DAT_00000001;
    apcStack_b0[0] = pbVar1[1]._M_dataplus._M_p;
    member = (pointer)pbVar1[1]._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_d8;
    local_c8._8_8_ = local_108._8_8_;
    local_c8._16_8_ = member;
    cmCatViews_abi_cxx11_((string *)&local_148,views);
    std::__cxx11::string::operator=((string *)&local_128,(string *)local_148._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_allocated_capacity != &local_138) {
      operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
    }
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  local_148._M_allocated_capacity = (size_type)&local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  bVar3 = cmsys::SystemTools::FileIsFullPath((string *)&local_148);
  if (!bVar3) {
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_d8._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_d8._0_8_ = psVar6->_M_string_length;
    local_108._8_8_ = &local_f8;
    local_108._0_8_ = 1;
    local_f8 = CONCAT71(local_f8._1_7_,0x2f);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c8._0_8_ = &DAT_00000001;
    apcStack_b0[0] = pbVar1[2]._M_dataplus._M_p;
    member = (pointer)pbVar1[2]._M_string_length;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_d8;
    local_c8._8_8_ = local_108._8_8_;
    local_c8._16_8_ = member;
    cmCatViews_abi_cxx11_((string *)local_168,views_00);
    std::__cxx11::string::operator=((string *)local_148._M_local_buf,(string *)local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,CONCAT71(local_168._17_7_,local_168[0x10]) + 1);
    }
  }
  if (((anonymous_namespace)::
       HandleRename(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleRename(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar5 != 0)) {
    local_78 = (pointer)0x0;
    ppStack_70 = (pointer)0x0;
    apcStack_90[1] = (char *)0x0;
    ppStack_80 = (pointer)0x0;
    auStack_a0._8_8_ = 0;
    apcStack_90[0] = (char *)0x0;
    apcStack_b0[1] = (char *)0x0;
    auStack_a0._0_8_ = (_Manager_type)0x0;
    local_c8._16_8_ = (pointer)0x0;
    apcStack_b0[0] = (char *)0x0;
    local_c8._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_c8._8_8_ = (void *)0x0;
    local_d8._0_8_ = (ActionMap *)0x0;
    local_d8._8_8_ = (pointer)0x0;
    name.super_string_view._M_str = "NO_REPLACE";
    name.super_string_view._M_len = 10;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)local_d8,name,(offset_in_Arguments_to_bool)member);
    name_00.super_string_view._M_str = "RESULT";
    name_00.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleRename(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleRename(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_d8,name_00,
               (offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                )member);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)&HandleRename::parser,(ActionMap *)local_d8);
    ArgumentParser::Base::~Base((Base *)local_d8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleRename::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleRename(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_c8._0_8_ = &local_68;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_168._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
  local_f8 = 0;
  local_f0._M_local_buf[0] = '\0';
  local_d8._0_8_ = &HandleRename::parser;
  local_d8._8_8_ = (pointer)0x0;
  local_c8._8_8_ = local_108;
  local_c8._16_8_ = (pointer)0x0;
  apcStack_b0[0] = (char *)0x0;
  apcStack_b0[1] = (char *)0x0;
  auStack_a0._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  auStack_a0._8_8_ = 0;
  apcStack_90[0] = (char *)0x0;
  apcStack_90[1] = (char *)0x0;
  ppStack_80 = (pointer)0x0;
  local_78 = (pointer)((ulong)local_78 & 0xffffffffffffff00);
  local_108._8_8_ = &local_f0;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_d8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_168,0);
  if ((pointer)apcStack_90[1] != (pointer)0x0) {
    (*(code *)apcStack_90[1])(auStack_a0 + 8,auStack_a0 + 8,3);
  }
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "RENAME unknown argument:\n  ",
                   local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_d8._0_8_ != (ActionMap *)local_c8) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
    }
    bVar3 = false;
    goto LAB_0035c278;
  }
  local_168._8_8_ = (pointer)0x0;
  local_168[0x10] = '\0';
  local_168._0_8_ = (pointer)(local_168 + 0x10);
  RVar4 = cmSystemTools::RenameFile
                    (&local_128,(string *)&local_148,(uint)(byte)local_108[0],(string *)local_168);
  if (RVar4 == Success) {
    bVar3 = true;
    if (local_f8 != 0) {
      value_00._M_str = "0";
      value_00._M_len = 1;
      cmMakefile::AddDefinition(status->Makefile,(string *)(local_108 + 8),value_00);
    }
  }
  else {
    if (RVar4 == NoReplace) {
      pcVar7 = "NO_REPLACE";
      if (local_f8 == 0) {
        pcVar7 = "path not replaced";
      }
      std::__cxx11::string::_M_replace((ulong)local_168,0,(char *)local_168._8_8_,(ulong)pcVar7);
LAB_0035c144:
      if (local_f8 != 0) {
        bVar3 = true;
        value._M_str = (char *)local_168._0_8_;
        value._M_len = local_168._8_8_;
        cmMakefile::AddDefinition(status->Makefile,(string *)(local_108 + 8),value);
        goto LAB_0035c25d;
      }
    }
    else if (RVar4 == Failure) goto LAB_0035c144;
    local_d8._0_8_ = (ActionMap *)0x1a;
    local_d8._8_8_ = "RENAME failed to rename\n  ";
    local_c8._0_8_ = local_128._M_string_length;
    local_c8._8_8_ = local_128._M_dataplus._M_p;
    local_c8._16_8_ = (pointer)0x6;
    apcStack_b0[0] = "\nto\n  ";
    apcStack_b0[1] = (char *)local_148._8_8_;
    auStack_a0._0_8_ = local_148._M_allocated_capacity;
    auStack_a0._8_8_ = 10;
    apcStack_90[0] = "\nbecause: ";
    apcStack_90[1] = (char *)local_168._8_8_;
    ppStack_80 = (pointer)local_168._0_8_;
    local_78 = (pointer)&DAT_00000001;
    ppStack_70 = (pointer)0x79b535;
    views_01._M_len = 7;
    views_01._M_array = (iterator)local_d8;
    cmCatViews_abi_cxx11_(&local_50,views_01);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
LAB_0035c25d:
  if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,CONCAT71(local_168._17_7_,local_168[0x10]) + 1);
  }
LAB_0035c278:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._8_8_ != &local_f0) {
    operator_delete((void *)local_108._8_8_,
                    CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool HandleRename(std::vector<std::string> const& args,
                  cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("RENAME must be called with at least two additional "
                    "arguments");
    return false;
  }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(oldname)) {
    oldname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }
  std::string newname = args[2];
  if (!cmsys::SystemTools::FileIsFullPath(newname)) {
    newname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[2]);
  }

  struct Arguments
  {
    bool NoReplace = false;
    std::string Result;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("NO_REPLACE"_s, &Arguments::NoReplace)
                               .Bind("RESULT"_s, &Arguments::Result);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);
  if (!unconsumedArgs.empty()) {
    status.SetError("RENAME unknown argument:\n  " + unconsumedArgs.front());
    return false;
  }

  std::string err;
  switch (cmSystemTools::RenameFile(oldname, newname,
                                    arguments.NoReplace
                                      ? cmSystemTools::Replace::No
                                      : cmSystemTools::Replace::Yes,
                                    &err)) {
    case cmSystemTools::RenameResult::Success:
      if (!arguments.Result.empty()) {
        status.GetMakefile().AddDefinition(arguments.Result, "0");
      }
      return true;
    case cmSystemTools::RenameResult::NoReplace:
      if (!arguments.Result.empty()) {
        err = "NO_REPLACE";
      } else {
        err = "path not replaced";
      }
      CM_FALLTHROUGH;
    case cmSystemTools::RenameResult::Failure:
      if (!arguments.Result.empty()) {
        status.GetMakefile().AddDefinition(arguments.Result, err);
        return true;
      }
      break;
  }
  status.SetError(cmStrCat("RENAME failed to rename\n  ", oldname, "\nto\n  ",
                           newname, "\nbecause: ", err, "\n"));
  return false;
}